

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Apu.cpp
# Opt level: O2

void __thiscall Sap_Apu::calc_periods(Sap_Apu *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int i;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  uVar2 = this->control;
  iVar3 = 0x72;
  if ((uVar2 & 1) == 0) {
    iVar3 = 0x1c;
  }
  for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
    bVar1 = this->oscs[0].regs[0];
    if ((uVar2 & "@\x10 \b"[uVar4]) == 0) {
      iVar5 = (bVar1 + 1) * iVar3;
    }
    else if ((uVar4 & 1) == 0) {
      iVar5 = bVar1 + 4;
    }
    else {
      iVar6 = (uint)bVar1 * 0x100;
      uVar7 = (uint)(byte)this[-1].last_time;
      iVar5 = (iVar6 + uVar7 + 1) * iVar3;
      if ((uVar2 & "UU"[uVar4 + 1]) != 0) {
        iVar5 = iVar6 + uVar7 + 7;
      }
    }
    this->oscs[0].period = iVar5;
    this = (Sap_Apu *)(this->oscs + 1);
  }
  return;
}

Assistant:

inline void Sap_Apu::calc_periods()
{
	 // 15/64 kHz clock
	int divider = 28;
	if ( this->control & 1 )
		divider = 114;
	
	for ( int i = 0; i < osc_count; i++ )
	{
		osc_t* const osc = &oscs [i];
		
		int const osc_reload = osc->regs [0]; // cache
		blargg_long period = (osc_reload + 1) * divider;
		static byte const fast_bits [osc_count] = { 1 << 6, 1 << 4, 1 << 5, 1 << 3 };
		if ( this->control & fast_bits [i] )
		{
			period = osc_reload + 4;
			if ( i & 1 )
			{
				period = osc_reload * 0x100L + osc [-1].regs [0] + 7;
				if ( !(this->control & fast_bits [i - 1]) )
					period = (period - 6) * divider;
				
				if ( (osc [-1].regs [1] & 0x1F) > 0x10 )
					debug_printf( "Use of slave channel in 16-bit mode not supported\n" );
			}
		}
		osc->period = period;
	}
}